

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

void __thiscall IlmThread_2_5::ThreadPool::setNumThreads(ThreadPool *this,int count)

{
  Data *pDVar1;
  __pointer_type pTVar2;
  int iVar3;
  long lVar4;
  DefaultThreadPoolProvider *this_00;
  __pointer_type pTVar5;
  __pointer_type pTVar6;
  ArgExc *this_01;
  pointer_____offset_0x10___ *ppuVar7;
  bool bVar8;
  
  if (count < 0) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (this_01,"Attempt to set the number of threads in a thread pool to a negative value.")
    ;
    __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar1 = this->_data;
  LOCK();
  (pDVar1->provUsers).super___atomic_base<int>._M_i =
       (pDVar1->provUsers).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pTVar6 = (pDVar1->provider)._M_b._M_p;
  iVar3 = (*pTVar6->_vptr_ThreadPoolProvider[2])(pTVar6);
  if (iVar3 == count) {
    bVar8 = false;
    goto LAB_001049d5;
  }
  if (iVar3 == 0) {
    ppuVar7 = &(anonymous_namespace)::NullThreadPoolProvider::typeinfo;
LAB_001049ad:
    lVar4 = __dynamic_cast(pTVar6,&ThreadPoolProvider::typeinfo,ppuVar7,0);
    bVar8 = lVar4 != 0;
  }
  else {
    if (count == 0) {
      ppuVar7 = &(anonymous_namespace)::DefaultThreadPoolProvider::typeinfo;
      goto LAB_001049ad;
    }
    bVar8 = false;
  }
  if (!bVar8) {
    (*pTVar6->_vptr_ThreadPoolProvider[3])(pTVar6,count);
  }
LAB_001049d5:
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->provUsers).super___atomic_base<int>._M_i =
         (pDVar1->provUsers).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  if (bVar8 && iVar3 != count) {
    pDVar1 = this->_data;
    if (count == 0) {
      pTVar5 = (__pointer_type)operator_new(8);
      pTVar5->_vptr_ThreadPoolProvider = (_func_int **)&PTR__ThreadPoolProvider_00108c90;
      pTVar2 = (pDVar1->provider)._M_b._M_p;
      LOCK();
      pTVar6 = (pDVar1->provider)._M_b._M_p;
      if (pTVar2 == pTVar6) {
        (pDVar1->provider)._M_b._M_p = pTVar5;
        pTVar6 = pTVar2;
      }
      UNLOCK();
      while (0 < (pDVar1->provUsers).super___atomic_base<int>._M_i) {
        sched_yield();
      }
    }
    else {
      this_00 = (DefaultThreadPoolProvider *)operator_new(0xe0);
      anon_unknown_5::DefaultThreadPoolProvider::DefaultThreadPoolProvider(this_00,count);
      pTVar2 = (pDVar1->provider)._M_b._M_p;
      LOCK();
      pTVar6 = (pDVar1->provider)._M_b._M_p;
      if (pTVar2 == pTVar6) {
        (pDVar1->provider)._M_b._M_p = (__pointer_type)this_00;
        pTVar6 = pTVar2;
      }
      UNLOCK();
      while (0 < (pDVar1->provUsers).super___atomic_base<int>._M_i) {
        sched_yield();
      }
    }
    if (pTVar6 != (__pointer_type)0x0) {
      (*pTVar6->_vptr_ThreadPoolProvider[5])(pTVar6);
      (*pTVar6->_vptr_ThreadPoolProvider[1])(pTVar6);
      return;
    }
  }
  return;
}

Assistant:

void
ThreadPool::setNumThreads (int count)
{
    if (count < 0)
        throw IEX_INTERNAL_NAMESPACE::ArgExc ("Attempt to set the number of threads "
               "in a thread pool to a negative value.");

    bool doReset = false;
    {
        Data::SafeProvider sp = _data->getProvider ();
        int curT = sp->numThreads ();
        if ( curT == count )
            return;

        if ( curT == 0 )
        {
            NullThreadPoolProvider *npp = dynamic_cast<NullThreadPoolProvider *>( sp.get() );
            if ( npp )
                doReset = true;
        }
        else if ( count == 0 )
        {
            DefaultThreadPoolProvider *dpp = dynamic_cast<DefaultThreadPoolProvider *>( sp.get() );
            if ( dpp )
                doReset = true;
        }
        if ( ! doReset )
            sp->setNumThreads( count );
    }

    if ( doReset )
    {
        if ( count == 0 )
            _data->setProvider( new NullThreadPoolProvider );
        else
            _data->setProvider( new DefaultThreadPoolProvider( count ) );
    }
}